

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

bool __thiscall
ON_SimpleArray<ON_SubDComponentId>::QuickSortAndRemoveDuplicates
          (ON_SimpleArray<ON_SubDComponentId> *this,
          _func_int_ON_SubDComponentId_ptr_ON_SubDComponentId_ptr *compar)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  ON_SubDComponentId *pOVar5;
  int iVar6;
  long lVar7;
  
  if (this->m_a != (ON_SubDComponentId *)0x0) {
    uVar1 = this->m_count;
    if (compar != (_func_int_ON_SubDComponentId_ptr_ON_SubDComponentId_ptr *)0x0 &&
        0 < (long)(int)uVar1) {
      if (uVar1 < 2) {
        return true;
      }
      lVar4 = 8;
      ON_qsort(this->m_a,(long)(int)uVar1,8,(_func_int_void_ptr_void_ptr *)compar);
      iVar2 = this->m_count;
      iVar6 = 1;
      if (1 < iVar2) {
        pOVar5 = this->m_a;
        iVar6 = 1;
        lVar3 = 1;
        do {
          iVar2 = (*compar)(pOVar5,(ON_SubDComponentId *)(this->m_a->m_valueAB + lVar4 + -5));
          if (iVar2 != 0) {
            lVar7 = (long)iVar6;
            if (lVar7 < lVar3) {
              this->m_a[lVar7] = this->m_a[lVar3];
            }
            pOVar5 = this->m_a + lVar7;
            iVar6 = iVar6 + 1;
          }
          lVar3 = lVar3 + 1;
          iVar2 = this->m_count;
          lVar4 = lVar4 + 8;
        } while (lVar3 < iVar2);
      }
      if (iVar2 - iVar6 == 0 || iVar2 < iVar6) {
        return true;
      }
      memset(this->m_a + iVar6,0,(long)(iVar2 - iVar6) << 3);
      if (iVar6 < 0) {
        return true;
      }
      if (this->m_capacity < iVar6) {
        return true;
      }
      this->m_count = iVar6;
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_SimpleArray<T>::QuickSortAndRemoveDuplicates( int (*compar)(const T*,const T*) )
{
  bool rc = false;
  if ( m_a && m_count > 0 && compar )
  {
    if (m_count > 1)
    {
      ON_qsort(m_a, m_count, sizeof(T), (int(*)(const void*, const void*))compar);
      const T* prev_ele = &m_a[0];
      int clean_count = 1;
      for (int i = 1; i < m_count; ++i)
      {
        if (0 == compar(prev_ele, &m_a[i]))
          continue; // duplicate
        if (i > clean_count)
          m_a[clean_count] = m_a[i];
        prev_ele = &m_a[clean_count];
        ++clean_count;
      }
      if (clean_count < m_count)
      {
        memset( (void*)(&m_a[clean_count]), 0, (m_count-clean_count)*sizeof(T) );
        SetCount(clean_count);
      }
    }
    rc = true;
  }
  return rc;
}